

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  cmMakefile *pcVar1;
  undefined8 config_00;
  bool bVar2;
  char *pcVar3;
  pointer this_00;
  string *psVar4;
  ulong uVar5;
  byte local_34a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  byte local_21a;
  byte local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  char *msvcRuntimeLibraryOptions;
  undefined1 local_110 [8];
  string msvcRuntimeLibrary;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_d8 [8];
  cmGeneratorExpression ge;
  string local_c0;
  char *local_a0;
  char *msvcRuntimeLibraryValue;
  string local_90;
  char *local_70;
  char *msvcRuntimeLibraryDefault;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string flagsVar;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"CMAKE_",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::operator+=((string *)local_50,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_50,"_FLAGS");
  AddConfigVariableFlags(this,flags,(string *)local_50,(string *)flagsVar.field_2._8_8_);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)((long)&msvcRuntimeLibraryValue + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&msvcRuntimeLibraryValue + 7));
  local_70 = pcVar3;
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) goto LAB_002109d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"MSVC_RUNTIME_LIBRARY",
             (allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pcVar3 = cmGeneratorTarget::GetProperty(target,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_a0 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    local_a0 = local_70;
  }
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          )0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_d8,(cmListFileBacktrace *)&cge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)((long)&msvcRuntimeLibrary.field_2 + 8),local_d8);
  this_00 = std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          *)((long)&msvcRuntimeLibrary.field_2 + 8));
  config_00 = flagsVar.field_2._8_8_;
  std::__cxx11::string::string((string *)&msvcRuntimeLibraryOptions);
  psVar4 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this,(string *)config_00,false,target,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)&msvcRuntimeLibraryOptions);
  std::__cxx11::string::string((string *)local_110,(string *)psVar4);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibraryOptions);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar1 = this->Makefile;
    std::operator+(&local_198,"CMAKE_",lang);
    std::operator+(&local_178,&local_198,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
    std::operator+(&local_158,&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    local_138 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar1 = this->Makefile;
      local_219 = 0;
      local_21a = 0;
      std::operator+(&local_1d8,"CMAKE_",lang);
      std::operator+(&local_1b8,&local_1d8,"_COMPILER_ID");
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1b8);
      bVar2 = std::operator==(psVar4,"MSVC");
      if (bVar2) {
LAB_0021075c:
        bVar2 = cmSystemTools::GetErrorOccuredFlag();
        local_34a = bVar2 ^ 0xff;
      }
      else {
        pcVar1 = this->Makefile;
        std::operator+(&local_218,"CMAKE_",lang);
        local_219 = 1;
        std::operator+(&local_1f8,&local_218,"_SIMULATE_ID");
        local_21a = 1;
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1f8);
        bVar2 = std::operator==(psVar4,"MSVC");
        local_34a = 0;
        if (bVar2) goto LAB_0021075c;
      }
      if ((local_21a & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      if ((local_219 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_218);
      }
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if ((local_34a & 1) != 0) {
        std::operator+(&local_2a0,"MSVC_RUNTIME_LIBRARY value \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
        std::operator+(&local_280,&local_2a0,"\' not known for this ");
        std::operator+(&local_260,&local_280,lang);
        std::operator+(&local_240,&local_260," compiler.");
        IssueMessage(this,FATAL_ERROR,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
    }
    else {
      AppendCompileOptions(this,flags,pcVar3,(char *)0x0);
    }
  }
  std::__cxx11::string::~string((string *)local_110);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)((long)&msvcRuntimeLibrary.field_2 + 8));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_d8);
LAB_002109d1:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);

  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  const char* msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (msvcRuntimeLibraryDefault && *msvcRuntimeLibraryDefault) {
    const char* msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(msvcRuntimeLibraryValue);
    std::string const msvcRuntimeLibrary =
      cge->Evaluate(this, config, false, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (const char* msvcRuntimeLibraryOptions =
            this->Makefile->GetDefinition(
              "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
              msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccuredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }
}